

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filenames.c
# Opt level: O2

void make_filepath(char **out,char *dirname,char *filename)

{
  char *__s;
  size_t sVar1;
  size_t sVar2;
  char *__s_00;
  
  if ((dirname != (char *)0x0 && filename != (char *)0x0) && (__s = strdup(dirname), *__s != '\0'))
  {
    sVar1 = strlen(dirname);
    sVar2 = strlen(filename);
    sVar1 = (size_t)((int)sVar2 + (int)sVar1 + 2);
    __s_00 = (char *)malloc(sVar1);
    *out = __s_00;
    if (__s_00 == (char *)0x0) {
      return;
    }
    *__s_00 = '\0';
    sVar2 = strlen(__s);
    if ((sVar2 != 0) && (__s[sVar2 - 1] == '/')) {
      __s[sVar2 - 1] = '\0';
    }
    snprintf(__s_00,sVar1,"%s%s%s",__s,"/",filename);
    free(__s);
    return;
  }
  *out = (char *)0x0;
  return;
}

Assistant:

void make_filepath(char **out, const char *dirname, const char *filename) {

    if (dirname == NULL || filename == NULL) {
        *out = NULL;
        return;
    }

    char *_dirname = strdup(dirname);
    if (*_dirname == NULL) {
        *out = NULL;
        return;
    }
    const int res_len = strlen(dirname) + strlen(filename) + 2;

    *out = malloc(res_len * sizeof(char));
    if (*out == NULL) {
        return;
    }
    strcpy(*out, "");

    char last_dirname_char = '\0';
    if (strlen(_dirname) > 0)
        last_dirname_char = _dirname[strlen(_dirname) - 1];

    if (last_dirname_char == *FILENAME_SEPARATOR)
        _dirname[strlen(_dirname) - 1] = '\0';

    snprintf(*out, res_len, "%s%s%s", _dirname, FILENAME_SEPARATOR, filename);

    free(_dirname);
}